

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestRequiredForeign * __thiscall
proto2_unittest::TestNestedRequiredForeign::_internal_mutable_payload
          (TestNestedRequiredForeign *this)

{
  Arena *arena;
  TestRequiredForeign *pTVar1;
  TestRequiredForeign *p;
  TestNestedRequiredForeign *this_local;
  
  if ((this->field_0)._impl_.payload_ == (TestRequiredForeign *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestRequiredForeign *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestRequiredForeign>(arena);
    (this->field_0)._impl_.payload_ = pTVar1;
  }
  return (this->field_0)._impl_.payload_;
}

Assistant:

inline ::proto2_unittest::TestRequiredForeign* PROTOBUF_NONNULL TestNestedRequiredForeign::_internal_mutable_payload() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.payload_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestRequiredForeign>(GetArena());
    _impl_.payload_ = reinterpret_cast<::proto2_unittest::TestRequiredForeign*>(p);
  }
  return _impl_.payload_;
}